

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.c
# Opt level: O2

void apx_eventLoop_run(apx_eventLoop_t *self,apx_eventHandlerFunc_t *eventHandler,
                      void *eventHandlerArg)

{
  int iVar1;
  bool bVar2;
  apx_event_t event;
  apx_event_t local_60;
  
  bVar2 = false;
  while (!bVar2) {
    iVar1 = sem_wait((sem_t *)&self->semaphore);
    if (iVar1 == 0) {
      pthread_spin_lock(&self->lock);
      if (self->exitFlag == false) {
        adt_rbfh_remove(&self->pendingEvents,(uint8_t *)&local_60);
        pthread_spin_unlock(&self->lock);
        if (eventHandler != (apx_eventHandlerFunc_t *)0x0) {
          (*eventHandler)(eventHandlerArg,&local_60);
        }
        bVar2 = false;
      }
      else {
        pthread_spin_unlock(&self->lock);
        bVar2 = true;
      }
    }
  }
  return;
}

Assistant:

void apx_eventLoop_run(apx_eventLoop_t *self, apx_eventHandlerFunc_t *eventHandler, void *eventHandlerArg)
{
   bool exitFlag = false;
   while(exitFlag == false)
   {
      apx_event_t event;
#ifdef _MSC_VER
      DWORD result = WaitForSingleObject(self->semaphore, INFINITE);
      if (result == WAIT_OBJECT_0)
#else
      int result = sem_wait(&self->semaphore);
      if (result == 0)
#endif
      {
         SPINLOCK_ENTER(self->lock);
         exitFlag = self->exitFlag;
         if (exitFlag == false)
         {
            adt_rbfh_remove(&self->pendingEvents,(uint8_t*) &event);
         }
         SPINLOCK_LEAVE(self->lock);
         if (exitFlag == false)
         {
            apx_eventLoop_processEvent(self, &event, eventHandler, eventHandlerArg);
         }
      }
   }
}